

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

void align_limit_to_full_utf8_characters(char *from,char **fromLimRef)

{
  byte bVar1;
  long lStack_28;
  uchar prev;
  size_t walked;
  char *fromLim;
  char **fromLimRef_local;
  char *from_local;
  
  walked = (size_t)*fromLimRef;
  lStack_28 = 0;
  do {
    if (walked <= from) {
LAB_005c8044:
      *fromLimRef = (char *)walked;
      return;
    }
    bVar1 = *(byte *)(walked - 1);
    if ((bVar1 & 0xf8) == 0xf0) {
      if (3 < lStack_28 + 1U) {
        walked = walked + 3;
        goto LAB_005c8044;
      }
      lStack_28 = 0;
    }
    else if ((bVar1 & 0xf0) == 0xe0) {
      if (2 < lStack_28 + 1U) {
        walked = walked + 2;
        goto LAB_005c8044;
      }
      lStack_28 = 0;
    }
    else if ((bVar1 & 0xe0) == 0xc0) {
      if (1 < lStack_28 + 1U) {
        walked = walked + 1;
        goto LAB_005c8044;
      }
      lStack_28 = 0;
    }
    else if ((bVar1 & 0x80) == 0) goto LAB_005c8044;
    walked = walked - 1;
    lStack_28 = lStack_28 + 1;
  } while( true );
}

Assistant:

void
align_limit_to_full_utf8_characters(const char * from, const char ** fromLimRef)
{
  const char * fromLim = *fromLimRef;
  size_t walked = 0;
  for (; fromLim > from; fromLim--, walked++) {
    const unsigned char prev = (unsigned char)fromLim[-1];
    if ((prev & 0xf8u) == 0xf0u) { /* 4-byte character, lead by 0b11110xxx byte */
      if (walked + 1 >= 4) {
        fromLim += 4 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0xf0u) == 0xe0u) { /* 3-byte character, lead by 0b1110xxxx byte */
      if (walked + 1 >= 3) {
        fromLim += 3 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0xe0u) == 0xc0u) { /* 2-byte character, lead by 0b110xxxxx byte */
      if (walked + 1 >= 2) {
        fromLim += 2 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0x80u) == 0x00u) { /* 1-byte character, matching 0b0xxxxxxx */
      break;
    }
  }
  *fromLimRef = fromLim;
}